

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O1

void __thiscall
slang::driver::SourceLoader::addSearchDirectories(SourceLoader *this,string_view pattern)

{
  path *path;
  string_view pattern_00;
  error_code ec_00;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> directories;
  error_code *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  uint local_b8 [2];
  error_category *local_b0;
  path local_a8;
  SmallVectorBase<std::filesystem::__cxx11::path> local_80;
  
  local_c8._M_str = pattern._M_str;
  local_c8._M_len = pattern._M_len;
  local_80.data_ = (pointer)local_80.firstElement;
  local_80.len = 0;
  local_80.cap = 2;
  local_b8[0] = 0;
  local_b0 = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path(&local_a8);
  pattern_00._M_str = (char *)0x1;
  pattern_00._M_len = (size_t)local_c8._M_str;
  svGlob((slang *)&local_a8,(path *)local_c8._M_len,pattern_00,(GlobMode)&local_80,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(local_b8,0),
         in_stack_ffffffffffffff30);
  std::filesystem::__cxx11::path::~path(&local_a8);
  if (local_b8[0] == 0) {
    path = (this->searchDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    _M_range_insert<std::filesystem::__cxx11::path*>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchDirectories,path,local_80.data_,local_80.data_ + local_80.len);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_a8,&local_c8,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = local_b8[0];
    path = &local_a8;
    ec_00._M_cat = local_b0;
    addError(this,path,ec_00);
    std::filesystem::__cxx11::path::~path(&local_a8);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup(&local_80,(EVP_PKEY_CTX *)path);
  return;
}

Assistant:

void SourceLoader::addSearchDirectories(std::string_view pattern) {
    SmallVector<fs::path> directories;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, directories, /* expandEnvVars */ false, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    searchDirectories.insert(searchDirectories.end(), directories.begin(), directories.end());
}